

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O0

void tonk::WriteU16_LE(uint8_t *data,uint16_t value)

{
  uint16_t value_local;
  uint8_t *data_local;
  
  *(uint16_t *)data = value;
  return;
}

Assistant:

inline void WriteU16_LE(uint8_t* data, uint16_t value)
{
#ifdef TONK_CPP_SDK_ALIGNED_ACCESSES
    data[1] = (uint8_t)(value >> 8);
    data[0] = (uint8_t)value;
#else
    *(uint16_t*)data = value;
#endif
}